

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O0

bool __thiscall cppnet::EpollEventActions::AddDisconnection(EpollEventActions *this,Event *event)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  int iVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  shared_ptr<cppnet::RWSocket> sVar6;
  undefined1 local_48 [8];
  shared_ptr<cppnet::RWSocket> socket;
  undefined1 local_30 [8];
  shared_ptr<cppnet::Socket> sock;
  Event *event_local;
  EpollEventActions *this_local;
  
  sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)event;
  uVar2 = Event::GetType(event);
  if ((uVar2 & 0x40) == 0) {
    Event::AddType((Event *)sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,ET_DISCONNECT);
    Event::GetSocket((Event *)local_30);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
    if (bVar1) {
      sVar6 = std::dynamic_pointer_cast<cppnet::RWSocket,cppnet::Socket>
                        ((shared_ptr<cppnet::Socket> *)local_48);
      uVar3 = (*(this->super_EventActions)._vptr_EventActions[9])
                        (this,sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,
                         sVar6.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._M_pi);
      this_local._7_1_ = (uVar3 & 1) != 0;
      if (this_local._7_1_) {
        peVar5 = std::
                 __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        iVar4 = (*(peVar5->super_Socket)._vptr_Socket[2])();
        OsHandle::Close(CONCAT44(extraout_var,iVar4));
        peVar5 = std::
                 __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        (*(peVar5->super_Socket)._vptr_Socket[0x11])(peVar5,0);
      }
      socket.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = 1;
      std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)local_48);
    }
    else {
      this_local._7_1_ = false;
      socket.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = 1;
    }
    std::shared_ptr<cppnet::Socket>::~shared_ptr((shared_ptr<cppnet::Socket> *)local_30);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EpollEventActions::AddDisconnection(Event* event) {
    if (event->GetType() & ET_DISCONNECT) {
        return false;
    }
    event->AddType(ET_DISCONNECT);
    
    auto sock = event->GetSocket();
    if (!sock) {
        return false;
    }
    
    std::shared_ptr<RWSocket> socket = std::dynamic_pointer_cast<RWSocket>(sock);
    if (!DelEvent(event)) {
        return false;
    }
    OsHandle::Close(socket->GetSocket());
    socket->OnDisConnect(CEC_SUCCESS);
    return true;
}